

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O0

fy_node * fy_node_create_vscalarf(fy_document *fyd,char *fmt,__va_list_tag *ap)

{
  char *pcVar1;
  long lVar2;
  fy_document *fyd_00;
  void *__format;
  int iVar3;
  size_t sVar4;
  char *__s;
  undefined8 uStack_90;
  char acStack_88 [15];
  bool local_79;
  char *local_78;
  fy_document *local_70;
  char *local_68;
  char *local_60;
  char *_s;
  char *_buf;
  int _sizew;
  int _size;
  va_list _ap_orig;
  char *__fmt;
  __va_list_tag *ap_local;
  char *fmt_local;
  fy_document *fyd_local;
  
  __s = acStack_88;
  if ((fyd == (fy_document *)0x0) || (fmt == (char *)0x0)) {
    fyd_local = (fy_document *)0x0;
  }
  else {
    _s = (char *)0x0;
    _ap_orig[0].overflow_arg_area = ap->reg_save_area;
    _sizew = ap->gp_offset;
    unique0x100000e1 = ap->fp_offset;
    _ap_orig[0]._0_8_ = ap->overflow_arg_area;
    uStack_90 = 0x12f794;
    local_70 = fyd;
    _ap_orig[0].reg_save_area = fmt;
    _buf._4_4_ = vsnprintf((char *)0x0,0,fmt,&_sizew);
    __format = _ap_orig[0].reg_save_area;
    if (_buf._4_4_ != -1) {
      lVar2 = -((long)_buf._4_4_ + 0x10U & 0xfffffffffffffff0);
      __s = acStack_88 + lVar2;
      iVar3 = _buf._4_4_ + 1;
      _s = __s;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x12f7d8;
      _buf._0_4_ = vsnprintf(__s,(long)iVar3,(char *)__format,ap);
      pcVar1 = _s;
      if (_buf._4_4_ != (int)_buf) {
        *(undefined8 *)((long)&uStack_90 + lVar2) = 0x12f804;
        __assert_fail("_size == _sizew",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                      ,0x1293,
                      "struct fy_node *fy_node_create_vscalarf(struct fy_document *, const char *, struct __va_list_tag *)"
                     );
      }
      local_78 = _s;
      *(undefined8 *)((long)&uStack_90 + lVar2) = 0x12f815;
      sVar4 = strlen(pcVar1);
      local_60 = local_78 + sVar4;
      while( true ) {
        local_79 = false;
        if (_s < local_60) {
          local_79 = local_60[-1] == '\n';
        }
        if (local_79 == false) break;
        pcVar1 = local_60 + -1;
        local_60 = local_60 + -1;
        *pcVar1 = '\0';
      }
    }
    pcVar1 = _s;
    fyd_00 = local_70;
    local_68 = _s;
    __s[-8] = -0x7c;
    __s[-7] = -8;
    __s[-6] = '\x12';
    __s[-5] = '\0';
    __s[-4] = '\0';
    __s[-3] = '\0';
    __s[-2] = '\0';
    __s[-1] = '\0';
    fyd_local = (fy_document *)fy_node_create_scalar_internal(fyd_00,pcVar1,0xffffffffffffffff,4);
  }
  return (fy_node *)fyd_local;
}

Assistant:

struct fy_node *fy_node_create_vscalarf(struct fy_document *fyd, const char *fmt, va_list ap) {
    if (!fyd || !fmt)
        return NULL;

    return fy_node_create_scalar_internal(fyd, alloca_vsprintf(fmt, ap), FY_NT, FYNCSIF_COPY);
}